

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BinaryEqualWithText_Test::testBody(TEST_TestFailure_BinaryEqualWithText_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_b0 [56];
  BinaryEqualFailure f;
  uchar actualData [1];
  uchar expectedData [1];
  TEST_TestFailure_BinaryEqualWithText_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  f.super_TestFailure.message_.bufferSize_._7_1_ = 0;
  f.super_TestFailure.message_.bufferSize_._6_1_ = 1;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)(local_b0 + 0x20),"text");
  BinaryEqualFailure::BinaryEqualFailure
            ((BinaryEqualFailure *)(local_b0 + 0x30),pUVar1,fileName,2,
             (uchar *)((long)&f.super_TestFailure.message_.bufferSize_ + 7),
             (uchar *)((long)&f.super_TestFailure.message_.bufferSize_ + 6),1,
             (SimpleString *)(local_b0 + 0x20));
  SimpleString::~SimpleString((SimpleString *)(local_b0 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_b0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_b0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "Message: text\n\texpected <00>\n\tbut was  <01>\n\tdifference starts at position 0 at: <         01         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x13f,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_b0);
  BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)(local_b0 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualWithText)
{
    const unsigned char expectedData[] = { 0x00 };
    const unsigned char actualData[] = { 0x01 };
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <00>\n"
                  "\tbut was  <01>\n"
                  "\tdifference starts at position 0 at: <         01         >\n"
                  "\t                                               ^", f);
}